

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facade_test.cc
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main() {
  Facade* facade = new Facade;
  facade->start();

  Database* db = new Database;
  bool db_connected = db->isConnected();
  assert(db_connected == true);

  Cache* cache = new Cache;
  bool cache_connected = cache->isConnected();
  assert(cache_connected == true);

  delete db;
  delete cache;
}